

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGhsMultiGenerator::VisitTarget
          (cmGlobalGhsMultiGenerator *this,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *temp,set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                *perm,
          vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *order,
          cmGeneratorTarget *ti)

{
  bool bVar1;
  iterator iVar2;
  TargetDependSet *targets;
  _Base_ptr p_Var3;
  bool bVar4;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  OrderedTargetDependSet sortedTargets;
  allocator<char> local_a1;
  cmGeneratorTarget *local_a0;
  string local_98;
  _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  local_78;
  
  local_a0 = ti;
  iVar2 = std::
          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::find(&perm->_M_t,&local_a0);
  if ((_Rb_tree_header *)iVar2._M_node == &(perm->_M_t)._M_impl.super__Rb_tree_header) {
    pVar5 = std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)temp,&local_a0);
    bVar4 = true;
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      targets = cmGlobalGenerator::GetTargetDirectDepends(&this->super_cmGlobalGenerator,local_a0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_a1);
      OrderedTargetDependSet::OrderedTargetDependSet
                ((OrderedTargetDependSet *)&local_78,targets,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      for (p_Var3 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar4 = (_Rb_tree_header *)p_Var3 != &local_78._M_impl.super__Rb_tree_header, bVar4;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        bVar1 = VisitTarget(this,temp,perm,order,*(cmGeneratorTarget **)(p_Var3 + 1));
        if (bVar1) goto LAB_00212aee;
      }
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)perm,&local_a0);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                (order,&local_a0);
LAB_00212aee:
      std::
      _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
      ::~_Rb_tree(&local_78);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmGlobalGhsMultiGenerator::VisitTarget(
  std::set<cmGeneratorTarget const*>& temp,
  std::set<cmGeneratorTarget const*>& perm,
  std::vector<cmGeneratorTarget const*>& order, cmGeneratorTarget const* ti)
{
  /* check if permanent mark is set*/
  if (perm.find(ti) == perm.end()) {
    /* set temporary mark; check if revisit*/
    if (temp.insert(ti).second) {
      /* sort targets lexicographically to ensure that nodes are always visited
       * in the same order */
      OrderedTargetDependSet sortedTargets(this->GetTargetDirectDepends(ti),
                                           "");
      for (auto& di : sortedTargets) {
        if (this->VisitTarget(temp, perm, order, di)) {
          return true;
        }
      }
      /* mark as complete; insert into beginning of list*/
      perm.insert(ti);
      order.push_back(ti);
      return false;
    }
    /* revisiting item - not a DAG */
    return true;
  }
  /* already complete */
  return false;
}